

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::LookupParameters::scale_parameters(LookupParameters *this,float a)

{
  pointer pTVar1;
  Tensor *p;
  pointer this_00;
  float local_44;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_40;
  
  pTVar1 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_44 = a;
  for (this_00 = (this->values).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1)
  {
    Tensor::operator*(&local_40,this_00);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::operator*=((DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_40,&local_44);
  }
  return;
}

Assistant:

void LookupParameters::scale_parameters(float a) {
  for (auto& p : values)
    (*p) *= a;
}